

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start,bool type)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Element *pEVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int end_00;
  long lVar10;
  int local_6c;
  int local_68;
  Element local_50;
  Nonzero<double> *local_40;
  Nonzero<double> *local_38;
  
  if (end <= start + 1) {
    return;
  }
  end_00 = end + -1;
  local_38 = keys;
LAB_001f08a9:
  uVar3 = end_00 - start;
  if ((int)uVar3 < 0x19) {
    if ((int)uVar3 < 1) {
      return;
    }
    SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
              (keys,end_00,compare,start);
    return;
  }
  iVar4 = (uVar3 >> 1) + start;
  local_40 = keys + iVar4;
  local_50.idx = keys[iVar4].idx;
  local_50.val = keys[iVar4].val;
  lVar8 = (long)end_00;
  lVar9 = (long)start;
  local_6c = end_00;
  iVar4 = start;
LAB_001f08f3:
  lVar5 = (long)iVar4;
  local_68 = end_00;
  if (end_00 < iVar4) {
    local_68 = iVar4;
  }
  if ((type & 1U) == 0) {
    lVar10 = (long)local_6c;
    pEVar6 = keys + lVar5;
    for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,pEVar6,&local_50);
      if (0 < iVar4) {
        local_68 = (int)lVar5;
        break;
      }
      pEVar6 = pEVar6 + 1;
    }
    keys = local_38;
    if (start <= local_6c) {
      local_6c = start;
    }
    pEVar6 = local_38 + lVar10;
    for (; lVar9 < lVar10; lVar10 = lVar10 + -1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,pEVar6,&local_50);
      if (iVar4 < 1) goto LAB_001f09ff;
      pEVar6 = pEVar6 + -1;
    }
  }
  else {
    pEVar6 = keys + lVar5;
    for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,pEVar6,&local_50);
      if (-1 < iVar4) {
        local_68 = (int)lVar5;
        break;
      }
      pEVar6 = pEVar6 + 1;
    }
    lVar10 = (long)local_6c;
    if (start <= local_6c) {
      local_6c = start;
    }
    pEVar6 = keys + lVar10;
    for (; lVar9 < lVar10; lVar10 = lVar10 + -1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,pEVar6,&local_50);
      if (iVar4 < 0) goto LAB_001f09ff;
      pEVar6 = pEVar6 + -1;
    }
  }
  goto LAB_001f0a02;
LAB_001f09ff:
  local_6c = (int)lVar10;
LAB_001f0a02:
  if (local_6c <= local_68) goto LAB_001f0a55;
  lVar5 = (long)local_68;
  dVar1 = keys[lVar5].val;
  iVar4 = keys[lVar5].idx;
  keys[lVar5].idx = keys[local_6c].idx;
  keys[lVar5].val = keys[local_6c].val;
  keys[local_6c].val = dVar1;
  keys[local_6c].idx = iVar4;
  iVar4 = local_68 + 1;
  local_6c = local_6c + -1;
  goto LAB_001f08f3;
LAB_001f0a55:
  if ((type & 1U) == 0) {
    lVar5 = (long)local_6c;
    if (start <= local_6c) {
      local_6c = start;
    }
    pEVar6 = keys + lVar5;
    for (; lVar9 < lVar5; lVar5 = lVar5 + -1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,&local_50,pEVar6);
      if (0 < iVar4) {
        local_6c = (int)lVar5;
        break;
      }
      pEVar6 = pEVar6 + -1;
    }
    if (local_6c == end_00) {
      dVar1 = keys[lVar8].val;
      iVar4 = keys[lVar8].idx;
      keys[lVar8].idx = local_40->idx;
      keys[lVar8].val = local_40->val;
      local_40->val = dVar1;
      local_40->idx = iVar4;
      local_6c = end_00 + -1;
    }
  }
  else {
    lVar5 = (long)local_68;
    if (local_68 <= end_00) {
      local_68 = end_00;
    }
    pEVar6 = keys + lVar5;
    for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
      iVar4 = SPxMainSM<double>::IdxCompare::operator()(compare,&local_50,pEVar6);
      if (iVar4 < 0) {
        local_68 = (int)lVar5;
        break;
      }
      pEVar6 = pEVar6 + 1;
    }
    if (local_68 == start) {
      dVar1 = keys[lVar9].val;
      iVar4 = keys[lVar9].idx;
      keys[lVar9].idx = local_40->idx;
      keys[lVar9].val = local_40->val;
      local_40->val = dVar1;
      local_40->idx = iVar4;
      local_68 = start + 1;
    }
  }
  if (end_00 - local_68 < local_6c - start) {
    bVar2 = end_00 <= local_68;
    iVar4 = start;
    iVar7 = end_00;
    start = local_68;
    end_00 = local_6c;
    if (bVar2) goto LAB_001f0bbb;
  }
  else {
    iVar4 = local_68;
    iVar7 = local_6c;
    if (local_6c <= start) goto LAB_001f0bbb;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
            (keys,iVar7 + 1,compare,start,(bool)(~type & 1));
LAB_001f0bbb:
  type = (bool)(type ^ 1);
  start = iVar4;
  goto LAB_001f08a9;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}